

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_24::AggregateErrorCollector::RecordError
          (AggregateErrorCollector *this,int param_1,int param_2,string_view message)

{
  string_view pc;
  ulong uVar1;
  AlphaNum local_88;
  AlphaNum local_58;
  int local_28;
  int local_24;
  int param_2_local;
  int param_1_local;
  AggregateErrorCollector *this_local;
  string_view message_local;
  
  message_local._M_len = (size_t)message._M_str;
  this_local = (AggregateErrorCollector *)message._M_len;
  local_28 = param_2;
  local_24 = param_1;
  _param_2_local = this;
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    absl::lts_20250127::AlphaNum::AlphaNum(&local_58,"; ");
    absl::lts_20250127::StrAppend(&this->error_,&local_58);
  }
  pc._M_str = (char *)message_local._M_len;
  pc._M_len = (size_t)this_local;
  absl::lts_20250127::AlphaNum::AlphaNum(&local_88,pc);
  absl::lts_20250127::StrAppend(&this->error_,&local_88);
  return;
}

Assistant:

void RecordError(int /* line */, int /* column */,
                   const absl::string_view message) override {
    if (!error_.empty()) {
      absl::StrAppend(&error_, "; ");
    }
    absl::StrAppend(&error_, message);
  }